

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O0

void __thiscall
CVmObjIterLookupTable::load_from_image
          (CVmObjIterLookupTable *this,vm_obj_id_t self,char *ptr,size_t siz)

{
  int iVar1;
  CVmVarHeap *pCVar2;
  CVmObjIterLookupTable *this_00;
  undefined4 extraout_var;
  char *in_RCX;
  void *in_RDX;
  undefined4 in_ESI;
  size_t in_RDI;
  char *pcVar3;
  uint flags;
  undefined4 in_stack_fffffffffffffff0;
  
  if (*(long *)(in_RDI + 8) != 0) {
    pCVar2 = CVmMemory::get_var_heap(G_mem_X);
    (*pCVar2->_vptr_CVmVarHeap[6])(pCVar2,*(undefined8 *)(in_RDI + 8));
    *(undefined8 *)(in_RDI + 8) = 0;
  }
  this_00 = (CVmObjIterLookupTable *)CVmMemory::get_var_heap(G_mem_X);
  pcVar3 = in_RCX;
  if (in_RCX < (char *)0x9) {
    pcVar3 = (char *)0x9;
  }
  iVar1 = (*(this_00->super_CVmObjIter).super_CVmObject._vptr_CVmObject[4])(this_00,pcVar3,in_RDI);
  flags = (uint)((ulong)pcVar3 >> 0x20);
  *(ulong *)(in_RDI + 8) = CONCAT44(extraout_var,iVar1);
  memcpy(*(void **)(in_RDI + 8),in_RDX,(size_t)in_RCX);
  CVmObjTable::save_image_pointer
            ((CVmObjTable *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
             (vm_obj_id_t)((ulong)in_RDX >> 0x20),in_RCX,in_RDI);
  get_flags((CVmObjIterLookupTable *)0x31741d);
  set_flags(this_00,flags);
  return;
}

Assistant:

void CVmObjIterLookupTable::load_from_image(VMG_ vm_obj_id_t self,
                                            const char *ptr, size_t siz)
{
    /* if we already have memory allocated, free it */
    if (ext_ != 0)
    {
        G_mem->get_var_heap()->free_mem(ext_);
        ext_ = 0;
    }

    /* 
     *   Allocate a new extension.  Make sure it's at least as large as the
     *   current standard extension size.  
     */
    ext_ = (char *)G_mem->get_var_heap()
           ->alloc_mem(siz < VMOBJITERLOOKUPTABLE_EXT_SIZE
                       ? VMOBJITERLOOKUPTABLE_EXT_SIZE : siz, this);

    /* copy the image data to our extension */
    memcpy(ext_, ptr, siz);

    /* 
     *   save our image data pointer in the object table, so that we can
     *   access it (without storing it ourselves) during a reload 
     */
    G_obj_table->save_image_pointer(self, ptr, siz);

    /* clear the undo flag */
    set_flags(get_flags() & ~VMOBJITERLOOKUPTABLE_UNDO);
}